

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCore.c
# Opt level: O2

Aig_MmFixed_t * Dar_ManComputeCuts(Aig_Man_t *pAig,int nCutsMax,int fSkipTtMin,int fVerbose)

{
  Aig_MmFixed_t *pAVar1;
  uint uVar2;
  abctime aVar3;
  Dar_Man_t *p;
  Aig_Obj_t *pAVar4;
  abctime aVar5;
  int level;
  int iVar6;
  int nCutsK;
  Dar_RwrPar_t local_54;
  
  aVar3 = Abc_Clock();
  Aig_ManCleanup(pAig);
  local_54.nSubgMax = 5;
  local_54.fFanout = 1;
  local_54.fUpdateLevel = 0;
  local_54.fUseZeros = 0;
  local_54.fPower = 0;
  local_54.fRecycle = 1;
  local_54.fVerbose = 0;
  local_54.fVeryVerbose = 0;
  local_54.nCutsMax = nCutsMax;
  p = Dar_ManStart(pAig,&local_54);
  Aig_MmFixedRestart(p->pMemCuts);
  Dar_ObjPrepareCuts(p,p->pAig->pConst1);
  for (iVar6 = 0; iVar6 < pAig->vCis->nSize; iVar6 = iVar6 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,iVar6);
    Dar_ObjPrepareCuts(p,pAVar4);
  }
  for (iVar6 = 0; iVar6 < pAig->vObjs->nSize; iVar6 = iVar6 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar6);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
      Dar_ObjComputeCuts(p,pAVar4,fSkipTtMin);
    }
  }
  if (fVerbose != 0) {
    uVar2 = Dar_ManCutCount(pAig,&nCutsK);
    printf("Nodes = %6d. Total cuts = %6d. 4-input cuts = %6d.\n",
           (ulong)(uint)(pAig->vObjs->nSize - pAig->nDeleted),(ulong)uVar2,(ulong)(uint)nCutsK);
    iVar6 = Aig_MmFixedReadMemUsage(p->pMemCuts);
    level = 0x75633c;
    printf("Cut size = %2d. Truth size = %2d. Total mem = %5.2f MB  ",
           (double)iVar6 * 9.5367431640625e-07,0x18,4);
    Abc_Print(level,"%s =","Runtime");
    aVar5 = Abc_Clock();
    Abc_Print(level,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
  }
  pAVar1 = p->pMemCuts;
  p->pMemCuts = (Aig_MmFixed_t *)0x0;
  Dar_ManStop(p);
  return pAVar1;
}

Assistant:

Aig_MmFixed_t * Dar_ManComputeCuts( Aig_Man_t * pAig, int nCutsMax, int fSkipTtMin, int fVerbose )
{ 
    Dar_Man_t * p;
    Dar_RwrPar_t Pars, * pPars = &Pars; 
    Aig_Obj_t * pObj;
    Aig_MmFixed_t * pMemCuts;
    int i, nNodes;
    abctime clk = Abc_Clock();
    // remove dangling nodes
    if ( (nNodes = Aig_ManCleanup( pAig )) )
    {
//        printf( "Removing %d nodes.\n", nNodes );
    }
    // create default parameters
    Dar_ManDefaultRwrParams( pPars );
    pPars->nCutsMax = nCutsMax;
    // create rewriting manager
    p = Dar_ManStart( pAig, pPars );
    // set elementary cuts for the PIs
//    Dar_ManCutsStart( p );
    Aig_MmFixedRestart( p->pMemCuts );
    Dar_ObjPrepareCuts( p, Aig_ManConst1(p->pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        Dar_ObjPrepareCuts( p, pObj );
    // compute cuts for each nodes in the topological order
    Aig_ManForEachNode( pAig, pObj, i )
        Dar_ObjComputeCuts( p, pObj, fSkipTtMin );
    // print verbose stats
    if ( fVerbose )
    {
//        Aig_Obj_t * pObj;
        int nCuts, nCutsK;//, i;
        nCuts = Dar_ManCutCount( pAig, &nCutsK );
        printf( "Nodes = %6d. Total cuts = %6d. 4-input cuts = %6d.\n",
            Aig_ManObjNum(pAig), nCuts, nCutsK );
        printf( "Cut size = %2d. Truth size = %2d. Total mem = %5.2f MB  ",
            (int)sizeof(Dar_Cut_t), (int)4, 1.0*Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20) );
        ABC_PRT( "Runtime", Abc_Clock() - clk );
/*
        Aig_ManForEachNode( pAig, pObj, i )
            if ( i % 300 == 0 )
                Dar_ObjCutPrint( pAig, pObj );
*/
    }
    // free the cuts
    pMemCuts = p->pMemCuts;
    p->pMemCuts = NULL;
//    Dar_ManCutsFree( p );
    // stop the rewriting manager
    Dar_ManStop( p );
    return pMemCuts;
}